

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tty.c
# Opt level: O2

wchar_t tty_stty(EditLine *el,wchar_t argc,wchar_t **argv)

{
  termios *ptVar1;
  anon_struct_16_3_f1fa40e6 *paVar2;
  wchar_t *pwVar3;
  termios *ptVar4;
  uchar uVar5;
  int iVar6;
  uint uVar7;
  char *pcVar9;
  char *pcVar10;
  size_t sVar11;
  uint uVar12;
  int *piVar13;
  wchar_t *__wcs;
  long lVar14;
  long lVar15;
  uint *puVar16;
  ulong uVar17;
  termios *local_468;
  size_t local_458;
  wchar_t *p;
  int local_440;
  uint local_43c;
  char name [1024];
  wchar_t wVar8;
  
  wVar8 = L'\xffffffff';
  if (argv != (wchar_t **)0x0) {
    ptVar1 = &(el->el_tty).t_ex;
    pcVar9 = ct_encode_string(*argv,&el->el_scratch);
    strlcpy(name,pcVar9,0x400);
    local_440 = 0;
    lVar14 = 0;
    ptVar4 = ptVar1;
    while( true ) {
      local_468 = ptVar4;
      lVar15 = lVar14;
      argv = argv + 1;
      __wcs = *argv;
      if (__wcs == (wchar_t *)0x0) break;
      if ((*__wcs != L'-') || (__wcs[2] != L'\0')) goto LAB_001126b3;
      wVar8 = __wcs[1];
      if (wVar8 == L'd') {
        lVar14 = 1;
        ptVar4 = &(el->el_tty).t_ed;
      }
      else if (wVar8 == L'q') {
        lVar14 = 2;
        ptVar4 = &(el->el_tty).t_ts;
      }
      else {
        lVar14 = 0;
        ptVar4 = ptVar1;
        if (wVar8 != L'x') {
          if (wVar8 != L'a') {
            fprintf((FILE *)el->el_errfile,"%s: Unknown switch `%lc\'.\n",name);
            return L'\xffffffff';
          }
          local_440 = local_440 + 1;
          lVar14 = lVar15;
          ptVar4 = local_468;
        }
      }
    }
    uVar12 = 0xffffffff;
    local_458 = 0;
    local_468 = (termios *)0x0;
    for (puVar16 = &ttymodes[0].m_value; pcVar9 = ((ttymodes_t *)(puVar16 + -2))->m_name,
        pcVar9 != (char *)0x0; puVar16 = puVar16 + 4) {
      uVar7 = puVar16[1];
      if (uVar7 != uVar12) {
        pcVar10 = "\n";
        if (uVar12 == 0xffffffff) {
          pcVar10 = "";
        }
        fprintf((FILE *)el->el_outfile,"%s%s",pcVar10,(el->el_tty).t_t[lVar15][(int)uVar7].t_name);
        local_468 = (termios *)strlen((el->el_tty).t_t[lVar15][(int)uVar7].t_name);
        local_458 = (size_t)local_468;
        uVar12 = uVar7;
      }
      if (uVar12 == 0xffffffff) {
        uVar17 = 0;
      }
      else {
        uVar7 = (el->el_tty).t_t[lVar15][(int)uVar12].t_setmask & *puVar16;
        if (uVar7 != 0) {
          uVar7 = 0x2b;
        }
        uVar17 = (ulong)uVar7;
        if (((el->el_tty).t_t[lVar15][(int)uVar12].t_clrmask & *puVar16) != 0) {
          uVar17 = 0x2d;
        }
      }
      iVar6 = (int)uVar17;
      if (iVar6 != 0 || local_440 != 0) {
        sVar11 = strlen(pcVar9);
        lVar14 = (sVar11 + 1) - (ulong)(iVar6 == 0);
        local_458 = local_458 + lVar14 + 1;
        if ((ulong)(long)(el->el_terminal).t_size.h <= local_458) {
          local_43c = uVar12;
          fprintf((FILE *)el->el_outfile,"\n%*s",(ulong)local_468 & 0xffffffff,"");
          local_458 = lVar14 + 1 + (long)local_468;
          uVar12 = local_43c;
        }
        if (iVar6 == 0) {
          fprintf((FILE *)el->el_outfile,"%s ",pcVar9);
        }
        else {
          fprintf((FILE *)el->el_outfile,"%c%s ",uVar17,pcVar9);
        }
      }
    }
    fputc(10,(FILE *)el->el_outfile);
LAB_001129d3:
    wVar8 = L'\0';
  }
  return wVar8;
LAB_001126b3:
  piVar13 = &ttymodes[0].m_type;
  if (__wcs != (wchar_t *)0x0) {
    wVar8 = *__wcs;
    if ((wVar8 == L'-') || (wVar8 == L'+')) {
      __wcs = __wcs + 1;
    }
    else {
      wVar8 = L'\0';
    }
    argv = argv + 1;
    p = wcschr(__wcs,L'=');
    do {
      pwVar3 = p;
      pcVar9 = ((ttymodes_t *)(piVar13 + -3))->m_name;
      if (pcVar9 == (char *)0x0) {
        fprintf((FILE *)el->el_errfile,"%s: Invalid argument `%ls\'.\n",name,__wcs);
        return L'\xffffffff';
      }
      pcVar10 = ct_encode_string(__wcs,&el->el_scratch);
      if (pwVar3 == (wchar_t *)0x0) {
        iVar6 = strcmp(pcVar9,pcVar10);
      }
      else {
        iVar6 = strncmp(pcVar9,pcVar10,(long)p - (long)__wcs >> 2);
      }
      if (iVar6 == 0) {
        if (p == (wchar_t *)0x0) {
          uVar12 = piVar13[-1];
          uVar7 = ~uVar12;
          if (wVar8 == L'-') {
            iVar6 = *piVar13;
            puVar16 = &(el->el_tty).t_t[lVar15][iVar6].t_setmask;
            *puVar16 = *puVar16 & uVar7;
            puVar16 = &(el->el_tty).t_t[lVar15][iVar6].t_clrmask;
            *puVar16 = *puVar16 | uVar12;
          }
          else if (wVar8 == L'+') {
            iVar6 = *piVar13;
            puVar16 = &(el->el_tty).t_t[lVar15][iVar6].t_setmask;
            *puVar16 = *puVar16 | uVar12;
            puVar16 = &(el->el_tty).t_t[lVar15][iVar6].t_clrmask;
            *puVar16 = *puVar16 & uVar7;
          }
          else {
            paVar2 = (el->el_tty).t_t[lVar15] + *piVar13;
            uVar17._0_4_ = paVar2->t_setmask;
            uVar17._4_4_ = paVar2->t_clrmask;
            uVar17 = CONCAT44(uVar7,uVar7) & uVar17;
            paVar2 = (el->el_tty).t_t[lVar15] + *piVar13;
            paVar2->t_setmask = (int)uVar17;
            paVar2->t_clrmask = (int)(uVar17 >> 0x20);
          }
          goto LAB_0011282a;
        }
        if (*piVar13 == 4) goto LAB_00112780;
      }
      piVar13 = piVar13 + 4;
    } while( true );
  }
  tty_setup_flags(el,local_468,(wchar_t)lVar15);
  if (((wchar_t)lVar15 == (uint)(el->el_tty).t_mode) &&
     (wVar8 = tty_setty(el,L'\x01',local_468), wVar8 == L'\xffffffff')) {
    return L'\xffffffff';
  }
  goto LAB_001129d3;
LAB_00112780:
  uVar12 = piVar13[-1];
  if (p[1] == L'\0') {
    uVar5 = (el->el_tty).t_vdisable;
    p = p + 1;
  }
  else {
    p = p + 1;
    wVar8 = parse__escape(&p);
    uVar5 = (uchar)wVar8;
  }
  if (uVar12 == 0) {
    __assert_fail("c != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/ksherlock[P]libedit/src/tty.c",
                  0x4f7,"int tty_stty(EditLine *, int, const wchar_t **)");
  }
  uVar7 = 0;
  if (uVar12 != 0) {
    for (; (uVar12 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
    }
  }
  if ((0x18 < uVar7) || ((0x183bc7fU >> (uVar7 & 0x1f) & 1) == 0)) {
    __assert_fail("c != -1",
                  "/workspace/llm4binary/github/license_c_cmakelists/ksherlock[P]libedit/src/tty.c",
                  0x4fa,"int tty_stty(EditLine *, int, const wchar_t **)");
  }
  local_468->c_cc[(&DAT_0011da78)[uVar7]] = uVar5;
LAB_0011282a:
  __wcs = *argv;
  goto LAB_001126b3;
}

Assistant:

libedit_private int
/*ARGSUSED*/
tty_stty(EditLine *el, int argc __attribute__((__unused__)),
    const wchar_t **argv)
{
	const ttymodes_t *m;
	char x;
	int aflag = 0;
	const wchar_t *s, *d;
        char name[EL_BUFSIZ];
	struct termios *tios = &el->el_tty.t_ex;
	int z = EX_IO;

	if (argv == NULL)
		return -1;
	strlcpy(name, ct_encode_string(*argv++, &el->el_scratch), sizeof(name));

	while (argv && *argv && argv[0][0] == '-' && argv[0][2] == '\0')
		switch (argv[0][1]) {
		case 'a':
			aflag++;
			argv++;
			break;
		case 'd':
			argv++;
			tios = &el->el_tty.t_ed;
			z = ED_IO;
			break;
		case 'x':
			argv++;
			tios = &el->el_tty.t_ex;
			z = EX_IO;
			break;
		case 'q':
			argv++;
			tios = &el->el_tty.t_ts;
			z = QU_IO;
			break;
		default:
			(void) fprintf(el->el_errfile,
			    "%s: Unknown switch `%lc'.\n",
			    name, (wint_t)argv[0][1]);
			return -1;
		}

	if (!argv || !*argv) {
		int i = -1;
		size_t len = 0, st = 0, cu;
		for (m = ttymodes; m->m_name; m++) {
			if (m->m_type != i) {
				(void) fprintf(el->el_outfile, "%s%s",
				    i != -1 ? "\n" : "",
				    el->el_tty.t_t[z][m->m_type].t_name);
				i = m->m_type;
				st = len =
				    strlen(el->el_tty.t_t[z][m->m_type].t_name);
			}
			if (i != -1) {
			    x = (el->el_tty.t_t[z][i].t_setmask & m->m_value)
				?  '+' : '\0';

			    if (el->el_tty.t_t[z][i].t_clrmask & m->m_value)
				x = '-';
			} else {
			    x = '\0';
			}

			if (x != '\0' || aflag) {

				cu = strlen(m->m_name) + (x != '\0') + 1;

				if (len + cu >=
				    (size_t)el->el_terminal.t_size.h) {
					(void) fprintf(el->el_outfile, "\n%*s",
					    (int)st, "");
					len = st + cu;
				} else
					len += cu;

				if (x != '\0')
					(void) fprintf(el->el_outfile, "%c%s ",
					    x, m->m_name);
				else
					(void) fprintf(el->el_outfile, "%s ",
					    m->m_name);
			}
		}
		(void) fprintf(el->el_outfile, "\n");
		return 0;
	}
	while (argv && (s = *argv++)) {
		const wchar_t *p;
		switch (*s) {
		case '+':
		case '-':
			x = (char)*s++;
			break;
		default:
			x = '\0';
			break;
		}
		d = s;
		p = wcschr(s, L'=');
		for (m = ttymodes; m->m_name; m++)
			if ((p ? strncmp(m->m_name, ct_encode_string(d,
			    &el->el_scratch), (size_t)(p - d)) :
			    strcmp(m->m_name, ct_encode_string(d,
			    &el->el_scratch))) == 0 &&
			    (p == NULL || m->m_type == MD_CHAR))
				break;

		if (!m->m_name) {
			(void) fprintf(el->el_errfile,
			    "%s: Invalid argument `%ls'.\n", name, d);
			return -1;
		}
		if (p) {
			int c = ffs((int)m->m_value);
			int v = *++p ? parse__escape(&p) :
			    el->el_tty.t_vdisable;
			assert(c != 0);
			c--;
			c = tty__getcharindex(c);
			assert(c != -1);
			tios->c_cc[c] = (cc_t)v;
			continue;
		}
		switch (x) {
		case '+':
			el->el_tty.t_t[z][m->m_type].t_setmask |= m->m_value;
			el->el_tty.t_t[z][m->m_type].t_clrmask &= ~m->m_value;
			break;
		case '-':
			el->el_tty.t_t[z][m->m_type].t_setmask &= ~m->m_value;
			el->el_tty.t_t[z][m->m_type].t_clrmask |= m->m_value;
			break;
		default:
			el->el_tty.t_t[z][m->m_type].t_setmask &= ~m->m_value;
			el->el_tty.t_t[z][m->m_type].t_clrmask &= ~m->m_value;
			break;
		}
	}

	tty_setup_flags(el, tios, z);
	if (el->el_tty.t_mode == z) {
		if (tty_setty(el, TCSADRAIN, tios) == -1) {
#ifdef DEBUG_TTY
			(void) fprintf(el->el_errfile, "%s: tty_setty: %s\n",
			    __func__, strerror(errno));
#endif /* DEBUG_TTY */
			return -1;
		}
	}

	return 0;
}